

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gla_ManRefSelect_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  Rfn_Obj_t RVar2;
  int *piVar3;
  Gia_Man_t *p_00;
  int iVar4;
  Rfn_Obj_t *pRVar5;
  Rfn_Obj_t *pRVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *p_01;
  bool bVar15;
  
  uVar9 = (ulong)(uint)f;
  do {
    while( true ) {
      pGVar7 = p->pGia->pObjs;
      if ((pObj < pGVar7) || (pGVar7 + p->pGia->nObjs <= pObj)) goto LAB_00580469;
      pVVar14 = p->pvRefis + (int)((ulong)((long)pObj - (long)pGVar7) >> 2) * -0x55555555;
      Vec_IntFillExtra(pVVar14,f + 1,(int)uVar9);
      if ((f < 0) || (pVVar14->nSize <= f)) goto LAB_00580488;
      piVar3 = pVVar14->pArray;
      if ((piVar3[(uint)f] & 2U) != 0) {
        return;
      }
      if (p->pPars->fPropFanout == 0) {
        piVar3[(uint)f] = piVar3[(uint)f] | 2;
        uVar10 = extraout_RDX;
      }
      else {
        Gia_ManRefSetAndPropFanout_rec(p,pObj,f,vSelect,Sign);
        uVar10 = extraout_RDX_00;
      }
      if ((piVar3[(uint)f] & 4U) != 0) goto LAB_0058034e;
      p_00 = p->pGia;
      uVar9 = *(ulong *)pObj;
      uVar8 = (uint)uVar9;
      uVar11 = (uint)(uVar9 >> 0x20);
      if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
        if ((~uVar9 & 0x1fffffff1fffffff) == 0) {
          return;
        }
        if ((int)(uVar11 & 0x1fffffff) < p_00->vCis->nSize - p_00->nRegs) {
          return;
        }
      }
      else if ((~uVar9 & 0x1fffffff1fffffff) == 0) {
        return;
      }
      if (((uVar8 & 0x9fffffff) == 0x9fffffff) &&
         (p_00->vCis->nSize - p_00->nRegs <= (int)(uVar11 & 0x1fffffff))) break;
      if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x1a5,
                      "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)");
      }
      pRVar5 = Gla_ObjRef(p,pObj + -(ulong)(uVar8 & 0x1fffffff),f);
      pRVar6 = Gla_ObjRef(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),f);
      RVar1 = *pRVar5;
      if ((*(byte *)(piVar3 + (uint)f) & 1) == 0) {
        uVar12 = *(ulong *)pObj;
        uVar11 = (uint)(uVar12 >> 0x1d) & 7 ^ (uint)RVar1;
        uVar8 = (uint)(uVar12 >> 0x20);
        if ((uVar11 & 1) == 0) {
          RVar2 = *pRVar6;
          uVar9 = (ulong)(uint)RVar2;
          if (((uVar8 >> 0x1d ^ (uint)RVar2) & 1) == 0) {
            uVar8 = (uint)RVar1 >> 3 & 0xffff;
            uVar11 = (uint)RVar2 >> 3 & 0xffff;
            uVar9 = (ulong)uVar11;
            if (uVar11 < uVar8) {
              if (uVar11 == 0) {
                return;
              }
              goto LAB_005802ff;
            }
          }
          else {
            if ((uVar11 & 1) != 0) goto LAB_005802df;
            uVar8 = (uint)RVar1 & 0x7fff8;
          }
          if (uVar8 == 0) {
            return;
          }
        }
        else {
LAB_005802df:
          uVar8 = uVar8 >> 0x1d ^ (uint)*pRVar6;
          uVar9 = (ulong)uVar8;
          if ((uVar8 & 1) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x1a2,
                          "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                         );
          }
          if (((uint)*pRVar6 & 0x7fff8) == 0) {
            return;
          }
LAB_005802ff:
          uVar12 = uVar12 >> 0x20;
        }
        pObj = pObj + -(ulong)((uint)uVar12 & 0x1fffffff);
      }
      else {
        uVar9 = extraout_RDX_01;
        if (((uint)RVar1 & 0x7fff8) != 0) {
          Gla_ManRefSelect_rec
                    (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect,Sign);
          uVar9 = extraout_RDX_02;
        }
        if (((uint)*pRVar6 & 0x7fff8) == 0) {
          return;
        }
        pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      }
    }
    bVar15 = f == 0;
    f = f - 1;
    if (bVar15) {
      return;
    }
    pGVar7 = Gia_ObjRoToRi(p_00,pObj);
    pObj = pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff);
    uVar9 = extraout_RDX_03;
  } while( true );
LAB_0058034e:
  if ((piVar3[(uint)f] & 0x7fff8U) == 0) {
    __assert_fail("(int)pRef->Prio > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x168,
                  "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)");
  }
  if (p->pPars->fPropFanout == 0) {
    pGVar7 = p->pGia->pObjs;
    if ((pGVar7 <= pObj) && (pObj < pGVar7 + p->pGia->nObjs)) {
      Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar7) >> 2) * -0x55555555);
      if (f < p->vObjCounts->nSize) {
        piVar3 = p->vObjCounts->pArray + (uint)f;
        *piVar3 = *piVar3 + 1;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
  else {
    lVar13 = (long)p->pPars->iFrame;
    if (lVar13 < 0) {
      return;
    }
    while( true ) {
      pGVar7 = p->pGia->pObjs;
      if ((pObj < pGVar7) || (pGVar7 + p->pGia->nObjs <= pObj)) break;
      pVVar14 = p->pvRefis;
      iVar4 = (int)((ulong)((long)pObj - (long)pGVar7) >> 2) * -0x55555555;
      p_01 = pVVar14 + iVar4;
      Vec_IntFillExtra(p_01,(int)lVar13 + 1,(int)uVar10);
      if (pVVar14[iVar4].nSize <= lVar13) {
LAB_00580488:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar10 = extraout_RDX_04;
      if ((*(byte *)(p_01->pArray + lVar13) & 2) == 0) {
        Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)lVar13,vSelect,Sign);
        uVar10 = extraout_RDX_05;
      }
      bVar15 = lVar13 < 1;
      lVar13 = lVar13 + -1;
      if (bVar15) {
        return;
      }
    }
  }
LAB_00580469:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gla_ManRefSelect_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{ 
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef = Gla_ObjRef( p, pObj, f );
//    assert( (int)pRef->Sign == Sign );
    if ( pRef->fVisit )
        return;
    if ( p->pPars->fPropFanout )
        Gia_ManRefSetAndPropFanout_rec( p, pObj, f, vSelect, Sign );
    else
        pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        if ( p->pPars->fPropFanout )
        {
            for ( i = p->pPars->iFrame; i >= 0; i-- )
                if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                    Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
            Vec_IntAddToEntry( p->vObjCounts, f, 1 );
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect, Sign );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rfn_Obj_t * pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
        Rfn_Obj_t * pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
        if ( pRef->Value == 1 )
        {
            if ( pRef0->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            if ( pRef1->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
        }
        else // select one value
        {
            if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef0->Prio <= pRef1->Prio ) // choice
                {
                    if ( pRef0->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
                }
                else
                {
                    if ( pRef1->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
                }
            }
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRef0->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            }
            else if ( (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef1->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}